

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O2

int __thiscall Edge::binarySearch(Edge *this,pair<int,_int> range,double angle)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  const_reference pvVar6;
  uint *puVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  int range_min;
  uint local_38;
  uint local_34;
  
  iVar9 = range.first;
  pvVar6 = std::
           deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::at(&this->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ,(long)iVar9);
  if ((pvVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
      [2] + -1e-07 <= angle) {
    pvVar6 = std::
             deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::at(&this->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ,(long)range >> 0x20);
    if (angle <= (pvVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2] + 1e-07) {
      uVar10 = (ulong)range >> 0x20;
      iVar3 = iVar9 + range.second;
      range_min = 1;
      iVar2 = 1;
      if (1 < iVar9) {
        range_min = iVar9;
        iVar2 = iVar9;
      }
      while( true ) {
        uVar4 = iVar3 / 2;
        pvVar6 = std::
                 deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ::at(&this->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ,(long)(int)uVar4);
        local_34 = range.first;
        if ((int)uVar10 <= (int)local_34) break;
        dVar1 = (pvVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[2];
        if (dVar1 + -1e-07 <= angle) {
          if (angle <= dVar1 + 1e-07) {
            puVar8 = &local_38;
            uVar5 = uVar4;
            goto LAB_0010b432;
          }
          range.second = 0;
          range.first = uVar4 + 1;
        }
        else {
          uVar10 = (ulong)uVar4;
        }
        iVar3 = range.first + (int)uVar10;
      }
      puVar8 = &local_34;
      uVar5 = local_34;
LAB_0010b432:
      local_38 = uVar4;
      puVar7 = (uint *)&range_min;
      if (iVar2 < (int)uVar5) {
        puVar7 = puVar8;
      }
      uVar4 = *puVar7;
    }
    else {
      uVar4 = 0xfffffffe;
    }
  }
  else {
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int Edge::binarySearch(std::pair<int, int> range, double angle) const{
    int s = range.first, e = range.second, m = static_cast<int>((s + e) / 2);
    if (angle < at(s).z() - bs_margin) return -1;
    else if (angle > at(e).z() + bs_margin) return -2;
    int range_min = std::max(1, range.first);
    double mid_angle = at(m).z();
    while (s < e) {
        if (mid_angle - bs_margin > angle) {
            e = m;
        } else if (mid_angle + bs_margin < angle) {
            s = m + 1;
        } else {
            return std::max(range_min, m);
        }
        m = static_cast<int>((s + e) / 2);
        mid_angle = at(m).z();
    } 
    return std::max(range_min, s);
}